

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)

{
  char cVar1;
  bool bVar2;
  CutResult CVar3;
  uint uVar4;
  qint64 qVar5;
  int in_R8D;
  uint uVar6;
  long in_FS_OFFSET;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  QByteArrayView needle;
  QByteArrayView data;
  iterator __begin1;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 local_78 [16];
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  needle.m_data = "UTC";
  needle.m_size = 3;
  bVar2 = QtPrivate::startsWith(id,needle);
  qVar5 = -0x80000000;
  if (4 < id.m_size && bVar2) {
    cVar1 = id.m_data[3];
    if ((cVar1 == '-') || (cVar1 == '+')) {
      local_b8._0_8_ = (QStringTokenizerBase<QLatin1String,_QChar> *)0x4;
      local_78._0_8_ = (undefined1 *)0xffffffffffffffff;
      CVar3 = QtPrivate::QContainerImplHelper::mid
                        (id.m_size,(qsizetype *)local_b8,(qsizetype *)local_78);
      if (CVar3 == Null) {
        local_58.m_haystack.m_size = 0;
        local_58.m_haystack.m_data = (storage_type *)0x0;
      }
      else {
        local_58.m_haystack.m_data = id.m_data + local_b8._0_8_;
        local_58.m_haystack.m_size = local_78._0_8_;
      }
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_58.m_needle.ucs = L':';
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_b8,&local_58)
      ;
      if (local_b8[0x18] != false) {
        uVar6 = 0;
        uVar4 = 0;
        do {
          uVar7 = uVar4;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          data.m_data = (storage_type *)0xa;
          data.m_size = local_b8._16_8_;
          QtPrivate::toUnsignedInteger
                    ((ParsedNumber<unsigned_long_long> *)local_78,(QtPrivate *)local_b8._8_8_,data,
                     in_R8D);
          if (((local_78._8_8_ & 1) != 0) || ((undefined1 *)0xffff < (ulong)local_78._0_8_))
          goto LAB_003f6826;
          uVar4 = 0x3c;
          if (uVar7 == 0) {
            uVar4 = 0x18;
          }
          if ((uVar4 <= (uint)local_78._0_8_) || (2 < uVar7)) goto LAB_003f6826;
          uVar6 = uVar6 * 0x3c + (uint)local_78._0_8_;
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_b8);
          uVar4 = uVar7 + 1;
        } while (local_b8[0x18] != false);
        if (uVar7 < 2) {
          uVar4 = 2 - (uVar7 + 1);
          uVar7 = -(uint)((int)(uVar4 ^ 0x80000000) < -0x80000000);
          uVar8 = -(uint)((int)(uVar4 ^ 0x80000000) < -0x7fffffff);
          uVar9 = -(uint)((int)(uVar4 ^ 0x80000000) < -0x7ffffffe);
          uVar4 = -(uint)((int)(uVar4 ^ 0x80000000) < -0x7ffffffd);
          uVar6 = (~uVar9 & 0x3c | uVar9 & 1) * (~uVar7 & uVar6 * 0x3c | uVar6 & uVar7) *
                  (~uVar8 & 0x3c | uVar8 & 1) * (~uVar4 & 0x3c | uVar4 & 1);
        }
        uVar4 = -uVar6;
        if (cVar1 != '-') {
          uVar4 = uVar6;
        }
        qVar5 = (qint64)(int)uVar4;
      }
    }
  }
LAB_003f6826:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)
{
    // Convert reasonable UTC[+-]\d+(:\d+){,2} to offset in seconds.
    // Assumption: id has already been tried as a CLDR UTC offset ID (notably
    // including plain "UTC" itself) and a system offset ID; it's neither.
    if (!id.startsWith("UTC") || id.size() < 5)
        return invalidSeconds(); // Doesn't match
    const char signChar = id.at(3);
    if (signChar != '-' && signChar != '+')
        return invalidSeconds(); // No sign
    const int sign = signChar == '-' ? -1 : 1;

    qint32 seconds = 0;
    int prior = 0; // Number of fields parsed thus far
    for (auto offset : QLatin1StringView(id.mid(4)).tokenize(':'_L1)) {
        bool ok = false;
        unsigned short field = offset.toUShort(&ok);
        // Bound hour above at 24, minutes and seconds at 60:
        if (!ok || field >= (prior ? 60 : 24))
            return invalidSeconds();
        seconds = seconds * 60 + field;
        if (++prior > 3)
            return invalidSeconds(); // Too many numbers
    }

    if (!prior)
        return invalidSeconds(); // No numbers

    while (prior++ < 3)
        seconds *= 60;

    return seconds * sign;
}